

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O0

shared_ptr<kratos::Var> __thiscall kratos::Var::slice_var(Var *this,shared_ptr<kratos::Var> *var)

{
  shared_ptr<kratos::Var> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::Var> sVar1;
  shared_ptr<kratos::Var> *var_local;
  Var *this_local;
  
  std::shared_ptr<kratos::Var>::shared_ptr((shared_ptr<kratos::Var> *)this,in_RDX);
  sVar1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::Var>)sVar1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<Var> slice_var(std::shared_ptr<Var> var) { return var; }